

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O3

void aom_highbd_lpf_vertical_4_dual_sse2
               (uint16_t *s,int p,uint8_t *blimit0,uint8_t *limit0,uint8_t *thresh0,uint8_t *blimit1
               ,uint8_t *limit1,uint8_t *thresh1,int bd)

{
  ulong uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [12];
  undefined1 auVar62 [12];
  undefined1 auVar63 [12];
  undefined1 auVar64 [12];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [12];
  undefined1 auVar72 [12];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  short sVar85;
  short sVar86;
  undefined4 uVar87;
  undefined8 uVar88;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  short sVar93;
  undefined4 uVar94;
  undefined1 auVar96 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  short sVar109;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  short sVar108;
  short sVar110;
  undefined1 auVar106 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar120 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  ushort uVar145;
  ushort uVar148;
  ushort uVar149;
  ushort uVar150;
  ushort uVar151;
  ushort uVar152;
  ushort uVar153;
  ushort uVar154;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar89 [12];
  undefined1 auVar92 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar95 [12];
  undefined1 auVar107 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  short sVar125;
  
  uVar1 = *(ulong *)(s + -2);
  uVar88 = *(undefined8 *)(s + (long)p + -2);
  auVar103._8_4_ = 0;
  auVar103._0_8_ = uVar1;
  auVar103._12_2_ = (short)(uVar1 >> 0x30);
  auVar103._14_2_ = (short)((ulong)uVar88 >> 0x30);
  auVar101._12_4_ = auVar103._12_4_;
  auVar101._8_2_ = 0;
  auVar101._0_8_ = uVar1;
  auVar101._10_2_ = (short)((ulong)uVar88 >> 0x20);
  auVar141._10_6_ = auVar101._10_6_;
  auVar141._8_2_ = (short)(uVar1 >> 0x20);
  auVar141._0_8_ = uVar1;
  auVar61._4_8_ = auVar141._8_8_;
  auVar61._2_2_ = (short)((ulong)uVar88 >> 0x10);
  auVar61._0_2_ = (short)(uVar1 >> 0x10);
  auVar102._0_4_ = CONCAT22((short)uVar88,(short)uVar1);
  auVar102._4_12_ = auVar61;
  uVar1 = *(ulong *)(s + (long)(p * 2) + -2);
  uVar88 = *(undefined8 *)(s + (long)(p * 3) + -2);
  auVar144._8_4_ = 0;
  auVar144._0_8_ = uVar1;
  auVar144._12_2_ = (short)(uVar1 >> 0x30);
  auVar144._14_2_ = (short)((ulong)uVar88 >> 0x30);
  auVar136._12_4_ = auVar144._12_4_;
  auVar136._8_2_ = 0;
  auVar136._0_8_ = uVar1;
  auVar136._10_2_ = (short)((ulong)uVar88 >> 0x20);
  auVar132._10_6_ = auVar136._10_6_;
  auVar132._8_2_ = (short)(uVar1 >> 0x20);
  auVar132._0_8_ = uVar1;
  auVar62._4_8_ = auVar132._8_8_;
  auVar62._2_2_ = (short)((ulong)uVar88 >> 0x10);
  auVar62._0_2_ = (short)(uVar1 >> 0x10);
  auVar111._6_2_ = (short)uVar88;
  auVar111._4_2_ = (short)uVar1;
  uVar1 = *(ulong *)(s + (long)(p * 4) + -2);
  uVar88 = *(undefined8 *)(s + (long)(p * 5) + -2);
  auVar99._8_4_ = 0;
  auVar99._0_8_ = uVar1;
  auVar99._12_2_ = (short)(uVar1 >> 0x30);
  auVar99._14_2_ = (short)((ulong)uVar88 >> 0x30);
  auVar98._12_4_ = auVar99._12_4_;
  auVar98._8_2_ = 0;
  auVar98._0_8_ = uVar1;
  auVar98._10_2_ = (short)((ulong)uVar88 >> 0x20);
  auVar97._10_6_ = auVar98._10_6_;
  auVar97._8_2_ = (short)(uVar1 >> 0x20);
  auVar97._0_8_ = uVar1;
  auVar63._4_8_ = auVar97._8_8_;
  auVar63._2_2_ = (short)((ulong)uVar88 >> 0x10);
  auVar63._0_2_ = (short)(uVar1 >> 0x10);
  auVar96._0_4_ = CONCAT22((short)uVar88,(short)uVar1);
  auVar96._4_12_ = auVar63;
  uVar1 = *(ulong *)(s + (long)(p * 6) + -2);
  uVar88 = *(undefined8 *)(s + (long)(p * 7) + -2);
  auVar122._8_4_ = 0;
  auVar122._0_8_ = uVar1;
  auVar122._12_2_ = (short)(uVar1 >> 0x30);
  auVar122._14_2_ = (short)((ulong)uVar88 >> 0x30);
  auVar121._12_4_ = auVar122._12_4_;
  auVar121._8_2_ = 0;
  auVar121._0_8_ = uVar1;
  auVar121._10_2_ = (short)((ulong)uVar88 >> 0x20);
  auVar120._10_6_ = auVar121._10_6_;
  auVar120._8_2_ = (short)(uVar1 >> 0x20);
  auVar120._0_8_ = uVar1;
  auVar64._4_8_ = auVar120._8_8_;
  auVar64._2_2_ = (short)((ulong)uVar88 >> 0x10);
  auVar64._0_2_ = (short)(uVar1 >> 0x10);
  auVar111._14_2_ = (short)uVar88;
  auVar111._12_2_ = (short)uVar1;
  auVar115._0_8_ = auVar102._0_8_;
  auVar115._8_4_ = auVar61._0_4_;
  auVar115._12_4_ = auVar62._0_4_;
  auVar111._0_4_ = auVar102._0_4_;
  auVar126._0_8_ = auVar96._0_8_;
  auVar126._8_4_ = auVar63._0_4_;
  auVar126._12_4_ = auVar64._0_4_;
  auVar111._8_4_ = auVar96._0_4_;
  auVar116._8_8_ = auVar126._8_8_;
  auVar116._0_8_ = auVar115._8_8_;
  auVar123._0_8_ = CONCAT44(auVar132._8_4_,auVar141._8_4_);
  auVar123._8_4_ = auVar101._12_4_;
  auVar123._12_4_ = auVar136._12_4_;
  auVar100._0_8_ = CONCAT44(auVar120._8_4_,auVar97._8_4_);
  auVar100._8_4_ = auVar98._12_4_;
  auVar100._12_4_ = auVar121._12_4_;
  auVar90._8_8_ = auVar100._0_8_;
  auVar90._0_8_ = auVar123._0_8_;
  auVar139._8_8_ = auVar100._8_8_;
  auVar139._0_8_ = auVar123._8_8_;
  auVar101 = psubusw(auVar90,auVar116);
  auVar127 = psubusw(auVar116,auVar90);
  auVar102 = psubusw(auVar139,auVar111);
  auVar136 = psubusw(auVar111,auVar139);
  auVar136 = auVar136 | auVar102;
  auVar102 = psubusw(auVar111,auVar116);
  auVar123 = psubusw(auVar116,auVar111);
  auVar123 = auVar123 | auVar102;
  auVar132 = psubusw(auVar139,auVar90);
  auVar103 = psubusw(auVar90,auVar139);
  auVar102 = *(undefined1 (*) [16])blimit0;
  auVar141 = *(undefined1 (*) [16])blimit1;
  auVar13[0xd] = 0;
  auVar13._0_13_ = auVar102._0_13_;
  auVar13[0xe] = auVar102[7];
  auVar19[0xc] = auVar102[6];
  auVar19._0_12_ = auVar102._0_12_;
  auVar19._13_2_ = auVar13._13_2_;
  auVar25[0xb] = 0;
  auVar25._0_11_ = auVar102._0_11_;
  auVar25._12_3_ = auVar19._12_3_;
  auVar31[10] = auVar102[5];
  auVar31._0_10_ = auVar102._0_10_;
  auVar31._11_4_ = auVar25._11_4_;
  auVar37[9] = 0;
  auVar37._0_9_ = auVar102._0_9_;
  auVar37._10_5_ = auVar31._10_5_;
  auVar43[8] = auVar102[4];
  auVar43._0_8_ = auVar102._0_8_;
  auVar43._9_6_ = auVar37._9_6_;
  auVar65._7_8_ = 0;
  auVar65._0_7_ = auVar43._8_7_;
  auVar73._1_8_ = SUB158(auVar65 << 0x40,7);
  auVar73[0] = auVar102[3];
  auVar73._9_6_ = 0;
  auVar74._1_10_ = SUB1510(auVar73 << 0x30,5);
  auVar74[0] = auVar102[2];
  auVar74._11_4_ = 0;
  auVar49[2] = auVar102[1];
  auVar49._0_2_ = auVar102._0_2_;
  auVar49._3_12_ = SUB1512(auVar74 << 0x20,3);
  auVar55._2_13_ = auVar49._2_13_;
  auVar55._0_2_ = auVar102._0_2_ & 0xff;
  auVar14[0xd] = 0;
  auVar14._0_13_ = auVar141._0_13_;
  auVar14[0xe] = auVar141[7];
  auVar20[0xc] = auVar141[6];
  auVar20._0_12_ = auVar141._0_12_;
  auVar20._13_2_ = auVar14._13_2_;
  auVar26[0xb] = 0;
  auVar26._0_11_ = auVar141._0_11_;
  auVar26._12_3_ = auVar20._12_3_;
  auVar32[10] = auVar141[5];
  auVar32._0_10_ = auVar141._0_10_;
  auVar32._11_4_ = auVar26._11_4_;
  auVar38[9] = 0;
  auVar38._0_9_ = auVar141._0_9_;
  auVar38._10_5_ = auVar32._10_5_;
  auVar44[8] = auVar141[4];
  auVar44._0_8_ = auVar141._0_8_;
  auVar44._9_6_ = auVar38._9_6_;
  auVar66._7_8_ = 0;
  auVar66._0_7_ = auVar44._8_7_;
  auVar75._1_8_ = SUB158(auVar66 << 0x40,7);
  auVar75[0] = auVar141[3];
  auVar75._9_6_ = 0;
  auVar76._1_10_ = SUB1510(auVar75 << 0x30,5);
  auVar76[0] = auVar141[2];
  auVar76._11_4_ = 0;
  auVar50[2] = auVar141[1];
  auVar50._0_2_ = auVar141._0_2_;
  auVar50._3_12_ = SUB1512(auVar76 << 0x20,3);
  auVar56._2_13_ = auVar50._2_13_;
  auVar56._0_2_ = auVar141._0_2_ & 0xff;
  auVar140._0_8_ = auVar55._0_8_;
  auVar140._8_8_ = auVar56._0_8_;
  auVar144 = ZEXT416(bd - 8);
  auVar141 = psllw(auVar140,auVar144);
  auVar103 = auVar103 | auVar132;
  auVar102 = *(undefined1 (*) [16])limit0;
  auVar15[0xd] = 0;
  auVar15._0_13_ = auVar102._0_13_;
  auVar15[0xe] = auVar102[7];
  auVar21[0xc] = auVar102[6];
  auVar21._0_12_ = auVar102._0_12_;
  auVar21._13_2_ = auVar15._13_2_;
  auVar27[0xb] = 0;
  auVar27._0_11_ = auVar102._0_11_;
  auVar27._12_3_ = auVar21._12_3_;
  auVar33[10] = auVar102[5];
  auVar33._0_10_ = auVar102._0_10_;
  auVar33._11_4_ = auVar27._11_4_;
  auVar39[9] = 0;
  auVar39._0_9_ = auVar102._0_9_;
  auVar39._10_5_ = auVar33._10_5_;
  auVar45[8] = auVar102[4];
  auVar45._0_8_ = auVar102._0_8_;
  auVar45._9_6_ = auVar39._9_6_;
  auVar67._7_8_ = 0;
  auVar67._0_7_ = auVar45._8_7_;
  auVar77._1_8_ = SUB158(auVar67 << 0x40,7);
  auVar77[0] = auVar102[3];
  auVar77._9_6_ = 0;
  auVar78._1_10_ = SUB1510(auVar77 << 0x30,5);
  auVar78[0] = auVar102[2];
  auVar78._11_4_ = 0;
  auVar51[2] = auVar102[1];
  auVar51._0_2_ = auVar102._0_2_;
  auVar51._3_12_ = SUB1512(auVar78 << 0x20,3);
  auVar57._2_13_ = auVar51._2_13_;
  auVar57._0_2_ = auVar102._0_2_ & 0xff;
  auVar102 = *(undefined1 (*) [16])limit1;
  auVar16[0xd] = 0;
  auVar16._0_13_ = auVar102._0_13_;
  auVar16[0xe] = auVar102[7];
  auVar22[0xc] = auVar102[6];
  auVar22._0_12_ = auVar102._0_12_;
  auVar22._13_2_ = auVar16._13_2_;
  auVar28[0xb] = 0;
  auVar28._0_11_ = auVar102._0_11_;
  auVar28._12_3_ = auVar22._12_3_;
  auVar34[10] = auVar102[5];
  auVar34._0_10_ = auVar102._0_10_;
  auVar34._11_4_ = auVar28._11_4_;
  auVar40[9] = 0;
  auVar40._0_9_ = auVar102._0_9_;
  auVar40._10_5_ = auVar34._10_5_;
  auVar46[8] = auVar102[4];
  auVar46._0_8_ = auVar102._0_8_;
  auVar46._9_6_ = auVar40._9_6_;
  auVar68._7_8_ = 0;
  auVar68._0_7_ = auVar46._8_7_;
  auVar79._1_8_ = SUB158(auVar68 << 0x40,7);
  auVar79[0] = auVar102[3];
  auVar79._9_6_ = 0;
  auVar80._1_10_ = SUB1510(auVar79 << 0x30,5);
  auVar80[0] = auVar102[2];
  auVar80._11_4_ = 0;
  auVar52[2] = auVar102[1];
  auVar52._0_2_ = auVar102._0_2_;
  auVar52._3_12_ = SUB1512(auVar80 << 0x20,3);
  auVar58._2_13_ = auVar52._2_13_;
  auVar58._0_2_ = auVar102._0_2_ & 0xff;
  auVar135._0_8_ = auVar57._0_8_;
  auVar135._8_8_ = auVar58._0_8_;
  auVar132 = psllw(auVar135,auVar144);
  sVar125 = auVar123._0_2_;
  sVar93 = auVar103._0_2_;
  auVar104._0_2_ = (ushort)(sVar93 < sVar125) * sVar125 | (ushort)(sVar93 >= sVar125) * sVar93;
  sVar125 = auVar123._2_2_;
  sVar93 = auVar103._2_2_;
  auVar104._2_2_ = (ushort)(sVar93 < sVar125) * sVar125 | (ushort)(sVar93 >= sVar125) * sVar93;
  sVar125 = auVar123._4_2_;
  sVar93 = auVar103._4_2_;
  auVar104._4_2_ = (ushort)(sVar93 < sVar125) * sVar125 | (ushort)(sVar93 >= sVar125) * sVar93;
  sVar125 = auVar123._6_2_;
  sVar93 = auVar103._6_2_;
  auVar104._6_2_ = (ushort)(sVar93 < sVar125) * sVar125 | (ushort)(sVar93 >= sVar125) * sVar93;
  sVar125 = auVar123._8_2_;
  sVar93 = auVar103._8_2_;
  auVar104._8_2_ = (ushort)(sVar93 < sVar125) * sVar125 | (ushort)(sVar93 >= sVar125) * sVar93;
  sVar125 = auVar123._10_2_;
  sVar93 = auVar103._10_2_;
  auVar104._10_2_ = (ushort)(sVar93 < sVar125) * sVar125 | (ushort)(sVar93 >= sVar125) * sVar93;
  sVar125 = auVar123._12_2_;
  sVar93 = auVar103._12_2_;
  sVar109 = auVar103._14_2_;
  auVar104._12_2_ = (ushort)(sVar93 < sVar125) * sVar125 | (ushort)(sVar93 >= sVar125) * sVar93;
  sVar125 = auVar123._14_2_;
  auVar104._14_2_ = (ushort)(sVar109 < sVar125) * sVar125 | (ushort)(sVar109 >= sVar125) * sVar109;
  auVar102 = *(undefined1 (*) [16])thresh0;
  auVar17[0xd] = 0;
  auVar17._0_13_ = auVar102._0_13_;
  auVar17[0xe] = auVar102[7];
  auVar23[0xc] = auVar102[6];
  auVar23._0_12_ = auVar102._0_12_;
  auVar23._13_2_ = auVar17._13_2_;
  auVar29[0xb] = 0;
  auVar29._0_11_ = auVar102._0_11_;
  auVar29._12_3_ = auVar23._12_3_;
  auVar35[10] = auVar102[5];
  auVar35._0_10_ = auVar102._0_10_;
  auVar35._11_4_ = auVar29._11_4_;
  auVar41[9] = 0;
  auVar41._0_9_ = auVar102._0_9_;
  auVar41._10_5_ = auVar35._10_5_;
  auVar47[8] = auVar102[4];
  auVar47._0_8_ = auVar102._0_8_;
  auVar47._9_6_ = auVar41._9_6_;
  auVar69._7_8_ = 0;
  auVar69._0_7_ = auVar47._8_7_;
  auVar81._1_8_ = SUB158(auVar69 << 0x40,7);
  auVar81[0] = auVar102[3];
  auVar81._9_6_ = 0;
  auVar82._1_10_ = SUB1510(auVar81 << 0x30,5);
  auVar82[0] = auVar102[2];
  auVar82._11_4_ = 0;
  auVar53[2] = auVar102[1];
  auVar53._0_2_ = auVar102._0_2_;
  auVar53._3_12_ = SUB1512(auVar82 << 0x20,3);
  auVar59._2_13_ = auVar53._2_13_;
  auVar59._0_2_ = auVar102._0_2_ & 0xff;
  auVar102 = *(undefined1 (*) [16])thresh1;
  auVar18[0xd] = 0;
  auVar18._0_13_ = auVar102._0_13_;
  auVar18[0xe] = auVar102[7];
  auVar24[0xc] = auVar102[6];
  auVar24._0_12_ = auVar102._0_12_;
  auVar24._13_2_ = auVar18._13_2_;
  auVar30[0xb] = 0;
  auVar30._0_11_ = auVar102._0_11_;
  auVar30._12_3_ = auVar24._12_3_;
  auVar36[10] = auVar102[5];
  auVar36._0_10_ = auVar102._0_10_;
  auVar36._11_4_ = auVar30._11_4_;
  auVar42[9] = 0;
  auVar42._0_9_ = auVar102._0_9_;
  auVar42._10_5_ = auVar36._10_5_;
  auVar48[8] = auVar102[4];
  auVar48._0_8_ = auVar102._0_8_;
  auVar48._9_6_ = auVar42._9_6_;
  auVar70._7_8_ = 0;
  auVar70._0_7_ = auVar48._8_7_;
  auVar83._1_8_ = SUB158(auVar70 << 0x40,7);
  auVar83[0] = auVar102[3];
  auVar83._9_6_ = 0;
  auVar84._1_10_ = SUB1510(auVar83 << 0x30,5);
  auVar84[0] = auVar102[2];
  auVar84._11_4_ = 0;
  auVar54[2] = auVar102[1];
  auVar54._0_2_ = auVar102._0_2_;
  auVar54._3_12_ = SUB1512(auVar84 << 0x20,3);
  auVar60._2_13_ = auVar54._2_13_;
  auVar60._0_2_ = auVar102._0_2_ & 0xff;
  auVar143._0_8_ = auVar59._0_8_;
  auVar143._8_8_ = auVar60._0_8_;
  auVar144 = psllw(auVar143,auVar144);
  auVar102 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  auVar102 = pshuflw(auVar102,auVar102,0);
  auVar124._0_4_ = auVar102._0_4_;
  auVar124._4_4_ = auVar124._0_4_;
  auVar124._8_4_ = auVar124._0_4_;
  auVar124._12_4_ = auVar124._0_4_;
  auVar102 = paddusw(auVar127 | auVar101,auVar127 | auVar101);
  auVar137._0_2_ = auVar136._0_2_ >> 1;
  auVar137._2_2_ = auVar136._2_2_ >> 1;
  auVar137._4_2_ = auVar136._4_2_ >> 1;
  auVar137._6_2_ = auVar136._6_2_ >> 1;
  auVar137._8_2_ = auVar136._8_2_ >> 1;
  auVar137._10_2_ = auVar136._10_2_ >> 1;
  auVar137._12_2_ = auVar136._12_2_ >> 1;
  auVar137._14_2_ = auVar136._14_2_ >> 1;
  auVar102 = paddusw(auVar137,auVar102);
  auVar102 = auVar102 ^ _DAT_004d8ba0;
  auVar141 = auVar141 ^ _DAT_004d8ba0;
  auVar138._0_2_ = -(ushort)(auVar141._0_2_ < auVar102._0_2_);
  auVar138._2_2_ = -(ushort)(auVar141._2_2_ < auVar102._2_2_);
  auVar138._4_2_ = -(ushort)(auVar141._4_2_ < auVar102._4_2_);
  auVar138._6_2_ = -(ushort)(auVar141._6_2_ < auVar102._6_2_);
  auVar138._8_2_ = -(ushort)(auVar141._8_2_ < auVar102._8_2_);
  auVar138._10_2_ = -(ushort)(auVar141._10_2_ < auVar102._10_2_);
  auVar138._12_2_ = -(ushort)(auVar141._12_2_ < auVar102._12_2_);
  auVar138._14_2_ = -(ushort)(auVar141._14_2_ < auVar102._14_2_);
  auVar102 = paddusw(auVar132,_DAT_005137c0);
  auVar102 = auVar102 & auVar138;
  sVar125 = auVar102._0_2_;
  auVar128._0_2_ =
       (sVar125 < (short)auVar104._0_2_) * auVar104._0_2_ |
       (ushort)(sVar125 >= (short)auVar104._0_2_) * sVar125;
  sVar125 = auVar102._2_2_;
  auVar128._2_2_ =
       (sVar125 < (short)auVar104._2_2_) * auVar104._2_2_ |
       (ushort)(sVar125 >= (short)auVar104._2_2_) * sVar125;
  sVar125 = auVar102._4_2_;
  auVar128._4_2_ =
       (sVar125 < (short)auVar104._4_2_) * auVar104._4_2_ |
       (ushort)(sVar125 >= (short)auVar104._4_2_) * sVar125;
  sVar125 = auVar102._6_2_;
  auVar128._6_2_ =
       (sVar125 < (short)auVar104._6_2_) * auVar104._6_2_ |
       (ushort)(sVar125 >= (short)auVar104._6_2_) * sVar125;
  sVar125 = auVar102._8_2_;
  auVar128._8_2_ =
       (sVar125 < (short)auVar104._8_2_) * auVar104._8_2_ |
       (ushort)(sVar125 >= (short)auVar104._8_2_) * sVar125;
  sVar125 = auVar102._10_2_;
  auVar128._10_2_ =
       (sVar125 < (short)auVar104._10_2_) * auVar104._10_2_ |
       (ushort)(sVar125 >= (short)auVar104._10_2_) * sVar125;
  sVar125 = auVar102._12_2_;
  sVar93 = auVar102._14_2_;
  auVar128._12_2_ =
       (sVar125 < (short)auVar104._12_2_) * auVar104._12_2_ |
       (ushort)(sVar125 >= (short)auVar104._12_2_) * sVar125;
  auVar128._14_2_ =
       (sVar93 < (short)auVar104._14_2_) * auVar104._14_2_ |
       (ushort)(sVar93 >= (short)auVar104._14_2_) * sVar93;
  auVar103 = psubsw(auVar116,auVar124);
  auVar101 = psubsw(auVar111,auVar124);
  auVar141 = psubsw(auVar90,auVar124);
  auVar102 = psubsw(auVar139,auVar124);
  auVar123 = psllw(_DAT_005137c0,ZEXT416((uint)bd));
  auVar142._8_4_ = 0xffffffff;
  auVar142._0_8_ = 0xffffffffffffffff;
  auVar142._12_4_ = 0xffffffff;
  auVar123 = paddsw(auVar123,auVar142);
  auVar123 = psubsw(auVar123,auVar124);
  auVar139 = psubsw((undefined1  [16])0x0,auVar124);
  auVar127 = psubsw(auVar101,auVar102);
  sVar108 = auVar123._0_2_;
  sVar125 = auVar127._0_2_;
  uVar145 = (ushort)(sVar108 < sVar125) * sVar108 | (ushort)(sVar108 >= sVar125) * sVar125;
  sVar110 = auVar123._2_2_;
  sVar125 = auVar127._2_2_;
  uVar148 = (ushort)(sVar110 < sVar125) * sVar110 | (ushort)(sVar110 >= sVar125) * sVar125;
  sVar7 = auVar123._4_2_;
  sVar125 = auVar127._4_2_;
  uVar149 = (ushort)(sVar7 < sVar125) * sVar7 | (ushort)(sVar7 >= sVar125) * sVar125;
  sVar8 = auVar123._6_2_;
  sVar125 = auVar127._6_2_;
  uVar150 = (ushort)(sVar8 < sVar125) * sVar8 | (ushort)(sVar8 >= sVar125) * sVar125;
  sVar9 = auVar123._8_2_;
  sVar125 = auVar127._8_2_;
  uVar151 = (ushort)(sVar9 < sVar125) * sVar9 | (ushort)(sVar9 >= sVar125) * sVar125;
  sVar10 = auVar123._10_2_;
  sVar125 = auVar127._10_2_;
  uVar152 = (ushort)(sVar10 < sVar125) * sVar10 | (ushort)(sVar10 >= sVar125) * sVar125;
  sVar11 = auVar123._12_2_;
  sVar125 = auVar127._12_2_;
  sVar93 = auVar127._14_2_;
  uVar153 = (ushort)(sVar11 < sVar125) * sVar11 | (ushort)(sVar11 >= sVar125) * sVar125;
  sVar12 = auVar123._14_2_;
  uVar154 = (ushort)(sVar12 < sVar93) * sVar12 | (ushort)(sVar12 >= sVar93) * sVar93;
  sVar125 = auVar139._0_2_;
  auVar146._0_2_ =
       (ushort)((short)uVar145 < sVar125) * sVar125 | ((short)uVar145 >= sVar125) * uVar145;
  sVar93 = auVar139._2_2_;
  auVar146._2_2_ = (ushort)((short)uVar148 < sVar93) * sVar93 | ((short)uVar148 >= sVar93) * uVar148
  ;
  sVar109 = auVar139._4_2_;
  auVar146._4_2_ =
       (ushort)((short)uVar149 < sVar109) * sVar109 | ((short)uVar149 >= sVar109) * uVar149;
  sVar2 = auVar139._6_2_;
  auVar146._6_2_ = (ushort)((short)uVar150 < sVar2) * sVar2 | ((short)uVar150 >= sVar2) * uVar150;
  sVar3 = auVar139._8_2_;
  auVar146._8_2_ = (ushort)((short)uVar151 < sVar3) * sVar3 | ((short)uVar151 >= sVar3) * uVar151;
  sVar4 = auVar139._10_2_;
  auVar146._10_2_ = (ushort)((short)uVar152 < sVar4) * sVar4 | ((short)uVar152 >= sVar4) * uVar152;
  sVar5 = auVar139._12_2_;
  auVar146._12_2_ = (ushort)((short)uVar153 < sVar5) * sVar5 | ((short)uVar153 >= sVar5) * uVar153;
  sVar6 = auVar139._14_2_;
  auVar146._14_2_ = (ushort)((short)uVar154 < sVar6) * sVar6 | ((short)uVar154 >= sVar6) * uVar154;
  auVar104 = auVar104 ^ _DAT_004d8ba0;
  auVar144 = auVar144 ^ _DAT_004d8ba0;
  auVar105._0_2_ = -(ushort)(auVar144._0_2_ < auVar104._0_2_);
  auVar105._2_2_ = -(ushort)(auVar144._2_2_ < auVar104._2_2_);
  auVar105._4_2_ = -(ushort)(auVar144._4_2_ < auVar104._4_2_);
  auVar105._6_2_ = -(ushort)(auVar144._6_2_ < auVar104._6_2_);
  auVar105._8_2_ = -(ushort)(auVar144._8_2_ < auVar104._8_2_);
  auVar105._10_2_ = -(ushort)(auVar144._10_2_ < auVar104._10_2_);
  auVar105._12_2_ = -(ushort)(auVar144._12_2_ < auVar104._12_2_);
  auVar105._14_2_ = -(ushort)(auVar144._14_2_ < auVar104._14_2_);
  auVar123 = psubsw(auVar141,auVar103);
  auVar139 = paddsw(auVar146 & auVar105,auVar123);
  auVar139 = paddsw(auVar139,auVar123);
  auVar123 = paddsw(auVar139,auVar123);
  sVar85 = auVar123._0_2_;
  uVar145 = (ushort)(sVar108 < sVar85) * sVar108 | (ushort)(sVar108 >= sVar85) * sVar85;
  sVar85 = auVar123._2_2_;
  uVar148 = (ushort)(sVar110 < sVar85) * sVar110 | (ushort)(sVar110 >= sVar85) * sVar85;
  sVar85 = auVar123._4_2_;
  uVar149 = (ushort)(sVar7 < sVar85) * sVar7 | (ushort)(sVar7 >= sVar85) * sVar85;
  sVar85 = auVar123._6_2_;
  uVar150 = (ushort)(sVar8 < sVar85) * sVar8 | (ushort)(sVar8 >= sVar85) * sVar85;
  sVar85 = auVar123._8_2_;
  uVar151 = (ushort)(sVar9 < sVar85) * sVar9 | (ushort)(sVar9 >= sVar85) * sVar85;
  sVar85 = auVar123._10_2_;
  uVar152 = (ushort)(sVar10 < sVar85) * sVar10 | (ushort)(sVar10 >= sVar85) * sVar85;
  sVar85 = auVar123._12_2_;
  sVar86 = auVar123._14_2_;
  uVar153 = (ushort)(sVar11 < sVar85) * sVar11 | (ushort)(sVar11 >= sVar85) * sVar85;
  uVar154 = (ushort)(sVar12 < sVar86) * sVar12 | (ushort)(sVar12 >= sVar86) * sVar86;
  auVar147._0_2_ =
       (ushort)((short)uVar145 < sVar125) * sVar125 | ((short)uVar145 >= sVar125) * uVar145;
  auVar147._2_2_ = (ushort)((short)uVar148 < sVar93) * sVar93 | ((short)uVar148 >= sVar93) * uVar148
  ;
  auVar147._4_2_ =
       (ushort)((short)uVar149 < sVar109) * sVar109 | ((short)uVar149 >= sVar109) * uVar149;
  auVar147._6_2_ = (ushort)((short)uVar150 < sVar2) * sVar2 | ((short)uVar150 >= sVar2) * uVar150;
  auVar147._8_2_ = (ushort)((short)uVar151 < sVar3) * sVar3 | ((short)uVar151 >= sVar3) * uVar151;
  auVar147._10_2_ = (ushort)((short)uVar152 < sVar4) * sVar4 | ((short)uVar152 >= sVar4) * uVar152;
  auVar147._12_2_ = (ushort)((short)uVar153 < sVar5) * sVar5 | ((short)uVar153 >= sVar5) * uVar153;
  auVar147._14_2_ = (ushort)((short)uVar154 < sVar6) * sVar6 | ((short)uVar154 >= sVar6) * uVar154;
  auVar123 = psubusw(auVar128,auVar132);
  auVar129._0_2_ = -(ushort)(auVar123._0_2_ == 0);
  auVar129._2_2_ = -(ushort)(auVar123._2_2_ == 0);
  auVar129._4_2_ = -(ushort)(auVar123._4_2_ == 0);
  auVar129._6_2_ = -(ushort)(auVar123._6_2_ == 0);
  auVar129._8_2_ = -(ushort)(auVar123._8_2_ == 0);
  auVar129._10_2_ = -(ushort)(auVar123._10_2_ == 0);
  auVar129._12_2_ = -(ushort)(auVar123._12_2_ == 0);
  auVar129._14_2_ = -(ushort)(auVar123._14_2_ == 0);
  auVar139 = paddsw(_DAT_00507960,auVar129 & auVar147);
  auVar123 = paddsw(auVar129 & auVar147,_DAT_005137e0);
  sVar85 = auVar139._0_2_;
  uVar145 = (ushort)(sVar108 < sVar85) * sVar108 | (ushort)(sVar108 >= sVar85) * sVar85;
  sVar85 = auVar139._2_2_;
  uVar148 = (ushort)(sVar110 < sVar85) * sVar110 | (ushort)(sVar110 >= sVar85) * sVar85;
  sVar85 = auVar139._4_2_;
  uVar149 = (ushort)(sVar7 < sVar85) * sVar7 | (ushort)(sVar7 >= sVar85) * sVar85;
  sVar85 = auVar139._6_2_;
  uVar150 = (ushort)(sVar8 < sVar85) * sVar8 | (ushort)(sVar8 >= sVar85) * sVar85;
  sVar85 = auVar139._8_2_;
  uVar151 = (ushort)(sVar9 < sVar85) * sVar9 | (ushort)(sVar9 >= sVar85) * sVar85;
  sVar85 = auVar139._10_2_;
  uVar152 = (ushort)(sVar10 < sVar85) * sVar10 | (ushort)(sVar10 >= sVar85) * sVar85;
  sVar85 = auVar139._12_2_;
  sVar86 = auVar139._14_2_;
  uVar153 = (ushort)(sVar11 < sVar85) * sVar11 | (ushort)(sVar11 >= sVar85) * sVar85;
  uVar154 = (ushort)(sVar12 < sVar86) * sVar12 | (ushort)(sVar12 >= sVar86) * sVar86;
  auVar133._0_2_ =
       (ushort)((short)uVar145 < sVar125) * sVar125 | ((short)uVar145 >= sVar125) * uVar145;
  auVar133._2_2_ = (ushort)((short)uVar148 < sVar93) * sVar93 | ((short)uVar148 >= sVar93) * uVar148
  ;
  auVar133._4_2_ =
       (ushort)((short)uVar149 < sVar109) * sVar109 | ((short)uVar149 >= sVar109) * uVar149;
  auVar133._6_2_ = (ushort)((short)uVar150 < sVar2) * sVar2 | ((short)uVar150 >= sVar2) * uVar150;
  auVar133._8_2_ = (ushort)((short)uVar151 < sVar3) * sVar3 | ((short)uVar151 >= sVar3) * uVar151;
  auVar133._10_2_ = (ushort)((short)uVar152 < sVar4) * sVar4 | ((short)uVar152 >= sVar4) * uVar152;
  auVar133._12_2_ = (ushort)((short)uVar153 < sVar5) * sVar5 | ((short)uVar153 >= sVar5) * uVar153;
  auVar133._14_2_ = (ushort)((short)uVar154 < sVar6) * sVar6 | ((short)uVar154 >= sVar6) * uVar154;
  sVar85 = auVar123._0_2_;
  uVar145 = (ushort)(sVar108 < sVar85) * sVar108 | (ushort)(sVar108 >= sVar85) * sVar85;
  sVar85 = auVar123._2_2_;
  uVar148 = (ushort)(sVar110 < sVar85) * sVar110 | (ushort)(sVar110 >= sVar85) * sVar85;
  sVar85 = auVar123._4_2_;
  uVar149 = (ushort)(sVar7 < sVar85) * sVar7 | (ushort)(sVar7 >= sVar85) * sVar85;
  sVar85 = auVar123._6_2_;
  uVar150 = (ushort)(sVar8 < sVar85) * sVar8 | (ushort)(sVar8 >= sVar85) * sVar85;
  sVar85 = auVar123._8_2_;
  uVar151 = (ushort)(sVar9 < sVar85) * sVar9 | (ushort)(sVar9 >= sVar85) * sVar85;
  sVar85 = auVar123._10_2_;
  uVar152 = (ushort)(sVar10 < sVar85) * sVar10 | (ushort)(sVar10 >= sVar85) * sVar85;
  sVar85 = auVar123._12_2_;
  sVar86 = auVar123._14_2_;
  uVar153 = (ushort)(sVar11 < sVar85) * sVar11 | (ushort)(sVar11 >= sVar85) * sVar85;
  uVar154 = (ushort)(sVar12 < sVar86) * sVar12 | (ushort)(sVar12 >= sVar86) * sVar86;
  auVar130._0_2_ =
       (ushort)((short)uVar145 < sVar125) * sVar125 | ((short)uVar145 >= sVar125) * uVar145;
  auVar130._2_2_ = (ushort)((short)uVar148 < sVar93) * sVar93 | ((short)uVar148 >= sVar93) * uVar148
  ;
  auVar130._4_2_ =
       (ushort)((short)uVar149 < sVar109) * sVar109 | ((short)uVar149 >= sVar109) * uVar149;
  auVar130._6_2_ = (ushort)((short)uVar150 < sVar2) * sVar2 | ((short)uVar150 >= sVar2) * uVar150;
  auVar130._8_2_ = (ushort)((short)uVar151 < sVar3) * sVar3 | ((short)uVar151 >= sVar3) * uVar151;
  auVar130._10_2_ = (ushort)((short)uVar152 < sVar4) * sVar4 | ((short)uVar152 >= sVar4) * uVar152;
  auVar130._12_2_ = (ushort)((short)uVar153 < sVar5) * sVar5 | ((short)uVar153 >= sVar5) * uVar153;
  auVar130._14_2_ = (ushort)((short)uVar154 < sVar6) * sVar6 | ((short)uVar154 >= sVar6) * uVar154;
  auVar139 = psraw(auVar133,3);
  auVar123 = psraw(auVar130,3);
  auVar141 = psubsw(auVar141,auVar139);
  sVar85 = auVar141._0_2_;
  uVar145 = (ushort)(sVar108 < sVar85) * sVar108 | (ushort)(sVar108 >= sVar85) * sVar85;
  sVar85 = auVar141._2_2_;
  uVar148 = (ushort)(sVar110 < sVar85) * sVar110 | (ushort)(sVar110 >= sVar85) * sVar85;
  sVar85 = auVar141._4_2_;
  uVar149 = (ushort)(sVar7 < sVar85) * sVar7 | (ushort)(sVar7 >= sVar85) * sVar85;
  sVar85 = auVar141._6_2_;
  uVar150 = (ushort)(sVar8 < sVar85) * sVar8 | (ushort)(sVar8 >= sVar85) * sVar85;
  sVar85 = auVar141._8_2_;
  uVar151 = (ushort)(sVar9 < sVar85) * sVar9 | (ushort)(sVar9 >= sVar85) * sVar85;
  sVar85 = auVar141._10_2_;
  uVar152 = (ushort)(sVar10 < sVar85) * sVar10 | (ushort)(sVar10 >= sVar85) * sVar85;
  sVar85 = auVar141._12_2_;
  sVar86 = auVar141._14_2_;
  uVar153 = (ushort)(sVar11 < sVar85) * sVar11 | (ushort)(sVar11 >= sVar85) * sVar85;
  uVar154 = (ushort)(sVar12 < sVar86) * sVar12 | (ushort)(sVar12 >= sVar86) * sVar86;
  auVar91._0_2_ =
       (ushort)((short)uVar145 < sVar125) * sVar125 | ((short)uVar145 >= sVar125) * uVar145;
  auVar91._2_2_ = (ushort)((short)uVar148 < sVar93) * sVar93 | ((short)uVar148 >= sVar93) * uVar148;
  auVar91._4_2_ =
       (ushort)((short)uVar149 < sVar109) * sVar109 | ((short)uVar149 >= sVar109) * uVar149;
  auVar91._6_2_ = (ushort)((short)uVar150 < sVar2) * sVar2 | ((short)uVar150 >= sVar2) * uVar150;
  auVar91._8_2_ = (ushort)((short)uVar151 < sVar3) * sVar3 | ((short)uVar151 >= sVar3) * uVar151;
  auVar91._10_2_ = (ushort)((short)uVar152 < sVar4) * sVar4 | ((short)uVar152 >= sVar4) * uVar152;
  auVar91._12_2_ = (ushort)((short)uVar153 < sVar5) * sVar5 | ((short)uVar153 >= sVar5) * uVar153;
  auVar91._14_2_ = (ushort)((short)uVar154 < sVar6) * sVar6 | ((short)uVar154 >= sVar6) * uVar154;
  auVar141 = paddsw(auVar123,auVar103);
  sVar85 = auVar141._0_2_;
  uVar145 = (ushort)(sVar108 < sVar85) * sVar108 | (ushort)(sVar108 >= sVar85) * sVar85;
  sVar85 = auVar141._2_2_;
  uVar148 = (ushort)(sVar110 < sVar85) * sVar110 | (ushort)(sVar110 >= sVar85) * sVar85;
  sVar85 = auVar141._4_2_;
  uVar149 = (ushort)(sVar7 < sVar85) * sVar7 | (ushort)(sVar7 >= sVar85) * sVar85;
  sVar85 = auVar141._6_2_;
  uVar150 = (ushort)(sVar8 < sVar85) * sVar8 | (ushort)(sVar8 >= sVar85) * sVar85;
  sVar85 = auVar141._8_2_;
  uVar151 = (ushort)(sVar9 < sVar85) * sVar9 | (ushort)(sVar9 >= sVar85) * sVar85;
  sVar85 = auVar141._10_2_;
  uVar152 = (ushort)(sVar10 < sVar85) * sVar10 | (ushort)(sVar10 >= sVar85) * sVar85;
  sVar85 = auVar141._12_2_;
  sVar86 = auVar141._14_2_;
  uVar153 = (ushort)(sVar11 < sVar85) * sVar11 | (ushort)(sVar11 >= sVar85) * sVar85;
  uVar154 = (ushort)(sVar12 < sVar86) * sVar12 | (ushort)(sVar12 >= sVar86) * sVar86;
  auVar131._0_2_ =
       (ushort)((short)uVar145 < sVar125) * sVar125 | ((short)uVar145 >= sVar125) * uVar145;
  auVar131._2_2_ = (ushort)((short)uVar148 < sVar93) * sVar93 | ((short)uVar148 >= sVar93) * uVar148
  ;
  auVar131._4_2_ =
       (ushort)((short)uVar149 < sVar109) * sVar109 | ((short)uVar149 >= sVar109) * uVar149;
  auVar131._6_2_ = (ushort)((short)uVar150 < sVar2) * sVar2 | ((short)uVar150 >= sVar2) * uVar150;
  auVar131._8_2_ = (ushort)((short)uVar151 < sVar3) * sVar3 | ((short)uVar151 >= sVar3) * uVar151;
  auVar131._10_2_ = (ushort)((short)uVar152 < sVar4) * sVar4 | ((short)uVar152 >= sVar4) * uVar152;
  auVar131._12_2_ = (ushort)((short)uVar153 < sVar5) * sVar5 | ((short)uVar153 >= sVar5) * uVar153;
  auVar131._14_2_ = (ushort)((short)uVar154 < sVar6) * sVar6 | ((short)uVar154 >= sVar6) * uVar154;
  auVar141 = paddsw(auVar91,auVar124);
  auVar103 = paddsw(auVar131,auVar124);
  auVar134._0_2_ = auVar139._0_2_ + 1;
  auVar134._2_2_ = auVar139._2_2_ + 1;
  auVar134._4_2_ = auVar139._4_2_ + 1;
  auVar134._6_2_ = auVar139._6_2_ + 1;
  auVar134._8_2_ = auVar139._8_2_ + 1;
  auVar134._10_2_ = auVar139._10_2_ + 1;
  auVar134._12_2_ = auVar139._12_2_ + 1;
  auVar134._14_2_ = auVar139._14_2_ + 1;
  auVar123 = psraw(auVar134,1);
  auVar102 = psubsw(auVar102,~auVar105 & auVar123);
  sVar85 = auVar102._0_2_;
  uVar145 = (ushort)(sVar108 < sVar85) * sVar108 | (ushort)(sVar108 >= sVar85) * sVar85;
  sVar85 = auVar102._2_2_;
  uVar148 = (ushort)(sVar110 < sVar85) * sVar110 | (ushort)(sVar110 >= sVar85) * sVar85;
  sVar85 = auVar102._4_2_;
  uVar149 = (ushort)(sVar7 < sVar85) * sVar7 | (ushort)(sVar7 >= sVar85) * sVar85;
  sVar85 = auVar102._6_2_;
  uVar150 = (ushort)(sVar8 < sVar85) * sVar8 | (ushort)(sVar8 >= sVar85) * sVar85;
  sVar85 = auVar102._8_2_;
  uVar151 = (ushort)(sVar9 < sVar85) * sVar9 | (ushort)(sVar9 >= sVar85) * sVar85;
  sVar85 = auVar102._10_2_;
  uVar152 = (ushort)(sVar10 < sVar85) * sVar10 | (ushort)(sVar10 >= sVar85) * sVar85;
  sVar85 = auVar102._12_2_;
  sVar86 = auVar102._14_2_;
  uVar153 = (ushort)(sVar11 < sVar85) * sVar11 | (ushort)(sVar11 >= sVar85) * sVar85;
  uVar154 = (ushort)(sVar12 < sVar86) * sVar12 | (ushort)(sVar12 >= sVar86) * sVar86;
  auVar127._0_2_ =
       (ushort)((short)uVar145 < sVar125) * sVar125 | ((short)uVar145 >= sVar125) * uVar145;
  auVar127._2_2_ = (ushort)((short)uVar148 < sVar93) * sVar93 | ((short)uVar148 >= sVar93) * uVar148
  ;
  auVar127._4_2_ =
       (ushort)((short)uVar149 < sVar109) * sVar109 | ((short)uVar149 >= sVar109) * uVar149;
  auVar127._6_2_ = (ushort)((short)uVar150 < sVar2) * sVar2 | ((short)uVar150 >= sVar2) * uVar150;
  auVar127._8_2_ = (ushort)((short)uVar151 < sVar3) * sVar3 | ((short)uVar151 >= sVar3) * uVar151;
  auVar127._10_2_ = (ushort)((short)uVar152 < sVar4) * sVar4 | ((short)uVar152 >= sVar4) * uVar152;
  auVar127._12_2_ = (ushort)((short)uVar153 < sVar5) * sVar5 | ((short)uVar153 >= sVar5) * uVar153;
  auVar127._14_2_ = (ushort)((short)uVar154 < sVar6) * sVar6 | ((short)uVar154 >= sVar6) * uVar154;
  auVar102 = paddsw(~auVar105 & auVar123,auVar101);
  sVar85 = auVar102._0_2_;
  uVar145 = (ushort)(sVar108 < sVar85) * sVar108 | (ushort)(sVar108 >= sVar85) * sVar85;
  sVar108 = auVar102._2_2_;
  uVar148 = (ushort)(sVar110 < sVar108) * sVar110 | (ushort)(sVar110 >= sVar108) * sVar108;
  sVar108 = auVar102._4_2_;
  uVar149 = (ushort)(sVar7 < sVar108) * sVar7 | (ushort)(sVar7 >= sVar108) * sVar108;
  sVar108 = auVar102._6_2_;
  uVar150 = (ushort)(sVar8 < sVar108) * sVar8 | (ushort)(sVar8 >= sVar108) * sVar108;
  sVar108 = auVar102._8_2_;
  uVar151 = (ushort)(sVar9 < sVar108) * sVar9 | (ushort)(sVar9 >= sVar108) * sVar108;
  sVar108 = auVar102._10_2_;
  uVar152 = (ushort)(sVar10 < sVar108) * sVar10 | (ushort)(sVar10 >= sVar108) * sVar108;
  sVar108 = auVar102._12_2_;
  sVar110 = auVar102._14_2_;
  uVar153 = (ushort)(sVar11 < sVar108) * sVar11 | (ushort)(sVar11 >= sVar108) * sVar108;
  uVar154 = (ushort)(sVar12 < sVar110) * sVar12 | (ushort)(sVar12 >= sVar110) * sVar110;
  auVar106._0_2_ =
       (ushort)((short)uVar145 < sVar125) * sVar125 | ((short)uVar145 >= sVar125) * uVar145;
  auVar106._2_2_ = (ushort)((short)uVar148 < sVar93) * sVar93 | ((short)uVar148 >= sVar93) * uVar148
  ;
  auVar106._4_2_ =
       (ushort)((short)uVar149 < sVar109) * sVar109 | ((short)uVar149 >= sVar109) * uVar149;
  auVar106._6_2_ = (ushort)((short)uVar150 < sVar2) * sVar2 | ((short)uVar150 >= sVar2) * uVar150;
  auVar106._8_2_ = (ushort)((short)uVar151 < sVar3) * sVar3 | ((short)uVar151 >= sVar3) * uVar151;
  auVar106._10_2_ = (ushort)((short)uVar152 < sVar4) * sVar4 | ((short)uVar152 >= sVar4) * uVar152;
  auVar106._12_2_ = (ushort)((short)uVar153 < sVar5) * sVar5 | ((short)uVar153 >= sVar5) * uVar153;
  auVar106._14_2_ = (ushort)((short)uVar154 < sVar6) * sVar6 | ((short)uVar154 >= sVar6) * uVar154;
  auVar102 = paddsw(auVar127,auVar124);
  auVar101 = paddsw(auVar106,auVar124);
  auVar114._0_12_ = auVar101._0_12_;
  auVar114._12_2_ = auVar101._6_2_;
  auVar114._14_2_ = auVar103._6_2_;
  auVar113._12_4_ = auVar114._12_4_;
  auVar113._0_10_ = auVar101._0_10_;
  auVar113._10_2_ = auVar103._4_2_;
  auVar112._10_6_ = auVar113._10_6_;
  auVar112._0_8_ = auVar101._0_8_;
  auVar112._8_2_ = auVar101._4_2_;
  auVar71._4_8_ = auVar112._8_8_;
  auVar71._2_2_ = auVar103._2_2_;
  auVar71._0_2_ = auVar101._2_2_;
  auVar119._0_12_ = auVar141._0_12_;
  auVar119._12_2_ = auVar141._6_2_;
  auVar119._14_2_ = auVar102._6_2_;
  auVar118._12_4_ = auVar119._12_4_;
  auVar118._0_10_ = auVar141._0_10_;
  auVar118._10_2_ = auVar102._4_2_;
  auVar117._10_6_ = auVar118._10_6_;
  auVar117._0_8_ = auVar141._0_8_;
  auVar117._8_2_ = auVar141._4_2_;
  auVar72._4_8_ = auVar117._8_8_;
  auVar72._2_2_ = auVar102._2_2_;
  auVar72._0_2_ = auVar141._2_2_;
  uVar94 = CONCAT22(auVar103._8_2_,auVar101._8_2_);
  auVar95._0_8_ = CONCAT26(auVar103._10_2_,CONCAT24(auVar101._10_2_,uVar94));
  auVar95._8_2_ = auVar101._12_2_;
  auVar95._10_2_ = auVar103._12_2_;
  auVar107._12_2_ = auVar101._14_2_;
  auVar107._0_12_ = auVar95;
  auVar107._14_2_ = auVar103._14_2_;
  uVar87 = CONCAT22(auVar102._8_2_,auVar141._8_2_);
  auVar89._0_8_ = CONCAT26(auVar102._10_2_,CONCAT24(auVar141._10_2_,uVar87));
  auVar89._8_2_ = auVar141._12_2_;
  auVar89._10_2_ = auVar102._12_2_;
  auVar92._12_2_ = auVar141._14_2_;
  auVar92._0_12_ = auVar89;
  auVar92._14_2_ = auVar102._14_2_;
  *(ulong *)(s + -2) =
       CONCAT44(CONCAT22(auVar102._0_2_,auVar141._0_2_),CONCAT22(auVar103._0_2_,auVar101._0_2_));
  *(ulong *)(s + (long)p + -2) = CONCAT44(auVar72._0_4_,auVar71._0_4_);
  *(ulong *)(s + (long)(p * 2) + -2) = CONCAT44(auVar117._8_4_,auVar112._8_4_);
  uVar88 = CONCAT44(auVar118._12_4_,auVar113._12_4_);
  *(undefined8 *)(s + (long)(p * 3) + -2) = uVar88;
  *(ulong *)(s + (long)(p * 4) + -2) = CONCAT44(uVar87,uVar94);
  *(ulong *)(s + (long)(p * 5) + -2) =
       CONCAT44((int)((ulong)auVar89._0_8_ >> 0x20),(int)((ulong)auVar95._0_8_ >> 0x20));
  *(ulong *)(s + (long)(p * 6) + -2) = CONCAT44(auVar89._8_4_,auVar95._8_4_);
  *(ulong *)(s + (long)(p * 7) + -2) = CONCAT44(auVar92._12_4_,auVar107._12_4_);
  return;
}

Assistant:

void aom_highbd_lpf_vertical_4_dual_sse2(
    uint16_t *s, int p, const uint8_t *blimit0, const uint8_t *limit0,
    const uint8_t *thresh0, const uint8_t *blimit1, const uint8_t *limit1,
    const uint8_t *thresh1, int bd) {
  __m128i x0, x1, x2, x3, x4, x5, x6, x7;
  __m128i d0, d1, d2, d3, d4, d5, d6, d7;
  __m128i ps[2], qs[2];

  x0 = _mm_loadl_epi64((__m128i *)(s - 2 + 0 * p));
  x1 = _mm_loadl_epi64((__m128i *)(s - 2 + 1 * p));
  x2 = _mm_loadl_epi64((__m128i *)(s - 2 + 2 * p));
  x3 = _mm_loadl_epi64((__m128i *)(s - 2 + 3 * p));
  x4 = _mm_loadl_epi64((__m128i *)(s - 2 + 4 * p));
  x5 = _mm_loadl_epi64((__m128i *)(s - 2 + 5 * p));
  x6 = _mm_loadl_epi64((__m128i *)(s - 2 + 6 * p));
  x7 = _mm_loadl_epi64((__m128i *)(s - 2 + 7 * p));

  highbd_transpose8x8_low_sse2(&x0, &x1, &x2, &x3, &x4, &x5, &x6, &x7, &d0, &d1,
                               &d2, &d3);

  highbd_lpf_internal_4_dual_sse2(&d0, &d1, &d2, &d3, ps, qs, blimit0, limit0,
                                  thresh0, blimit1, limit1, thresh1, bd);

  highbd_transpose4x8_8x4_sse2(&ps[1], &ps[0], &qs[0], &qs[1], &d0, &d1, &d2,
                               &d3, &d4, &d5, &d6, &d7);

  _mm_storel_epi64((__m128i *)(s - 2 + 0 * p), d0);
  _mm_storel_epi64((__m128i *)(s - 2 + 1 * p), d1);
  _mm_storel_epi64((__m128i *)(s - 2 + 2 * p), d2);
  _mm_storel_epi64((__m128i *)(s - 2 + 3 * p), d3);
  _mm_storel_epi64((__m128i *)(s - 2 + 4 * p), d4);
  _mm_storel_epi64((__m128i *)(s - 2 + 5 * p), d5);
  _mm_storel_epi64((__m128i *)(s - 2 + 6 * p), d6);
  _mm_storel_epi64((__m128i *)(s - 2 + 7 * p), d7);
}